

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O2

void QNetworkFile::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000034;
  
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        return;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
  }
  else if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkFile::*)(bool)>
                      ((QtMocHelpers *)_a,(void **)finished,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QNetworkFile::*)(QHttpHeaders::WellKnownHeader,QByteArray_const&)>
                          ((QtMocHelpers *)_a,(void **)headerRead,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QNetworkFile::*)(QNetworkReply::NetworkError,QString_const&)>
                ((QtMocHelpers *)_a,(void **)networkError,0,2);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      finished((QNetworkFile *)_o,*_a[1]);
      return;
    case 1:
      headerRead((QNetworkFile *)_o,*_a[1],(QByteArray *)_a[2]);
      return;
    case 2:
      networkError((QNetworkFile *)_o,*_a[1],(QString *)_a[2]);
      return;
    case 3:
      open((QNetworkFile *)_o,(char *)CONCAT44(in_register_00000034,_c),_id);
      return;
    case 4:
      (**(code **)(*(long *)_o + 0x70))();
      return;
    }
  }
  return;
}

Assistant:

void QNetworkFile::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkFile *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->headerRead((*reinterpret_cast< std::add_pointer_t<QHttpHeaders::WellKnownHeader>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->networkError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->open(); break;
        case 4: _t->close(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(bool )>(_a, &QNetworkFile::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QHttpHeaders::WellKnownHeader , const QByteArray & )>(_a, &QNetworkFile::headerRead, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QNetworkFile::networkError, 2))
            return;
    }
}